

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseNat(WastParser *this,uint64_t *out_nat)

{
  char *s;
  ulong uVar1;
  Location loc;
  bool bVar2;
  Result RVar3;
  Literal *pLVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  allocator local_79;
  Token token;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  bVar2 = PeekMatch(this,Last_Literal);
  if (bVar2) {
    Consume(&token,this);
    pLVar4 = Token::literal(&token);
    s = (pLVar4->text).data_;
    uVar1 = (pLVar4->text).size_;
    RVar3 = ParseUint64(s,s + uVar1,out_nat);
    if (RVar3.enum_ == Error) {
      loc.filename.data_._4_4_ = token.loc.filename.data_._4_4_;
      loc.filename.data_._0_4_ = token.loc.filename.data_._0_4_;
      loc.filename.size_._0_4_ = (undefined4)token.loc.filename.size_;
      loc.filename.size_._4_4_ = token.loc.filename.size_._4_4_;
      loc.field_1.field_0.line = token.loc.field_1.field_0.line;
      loc.field_1.field_0.first_column = token.loc.field_1.field_0.first_column;
      loc.field_1.field_0.last_column = token.loc.field_1.field_0.last_column;
      loc.field_1._12_4_ = token.loc.field_1._12_4_;
      Error(this,loc,"invalid int \"%.*s\"",uVar1 & 0xffffffff,s,in_R8,in_R9);
    }
    RVar3.enum_ = Ok;
  }
  else {
    std::__cxx11::string::string((string *)&token,"a natural number",&local_79);
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,&token
               ,&token.token_type_);
    RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_38,"123");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_38);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result WastParser::ParseNat(uint64_t* out_nat) {
  WABT_TRACE(ParseNat);
  if (!PeekMatch(TokenType::Nat)) {
    return ErrorExpected({"a natural number"}, "123");
  }

  Token token = Consume();
  string_view sv = token.literal().text;
  if (Failed(ParseUint64(sv.begin(), sv.end(), out_nat))) {
    Error(token.loc, "invalid int \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(sv));
  }

  return Result::Ok;
}